

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

InputSource * __thiscall
xercesc_4_0::DGXMLScanner::resolveSystemId(DGXMLScanner *this,XMLCh *sysId,XMLCh *pubId)

{
  XMLEntityHandler *pXVar1;
  undefined8 baseURL;
  bool bVar2;
  uint uVar3;
  int iVar4;
  XMLBuffer *this_00;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLBuffer *normalizedURI_00;
  MalformedURLException *pMVar6;
  XMLBuffer *resolvedSysId;
  XMLBufBid ddSys;
  XMLURL urlTmp;
  LastExtEntityInfo lastInfo_1;
  undefined1 local_c8 [8];
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo lastInfo;
  InputSource *srcToFill;
  XMLBuffer *expSysId;
  XMLBufBid bbSys;
  XMLCh *normalizedURI;
  XMLBuffer *local_40;
  XMLBuffer *normalizedSysId;
  XMLBufBid nnSys;
  XMLCh *pubId_local;
  XMLCh *sysId_local;
  DGXMLScanner *this_local;
  
  nnSys.fMgr = (XMLBufferMgr *)pubId;
  XMLBufBid::XMLBufBid((XMLBufBid *)&normalizedSysId,&(this->super_XMLScanner).fBufMgr);
  local_40 = XMLBufBid::getBuffer((XMLBufBid *)&normalizedSysId);
  normalizedURI._2_2_ = 0xffff;
  XMLString::removeChar(sysId,(XMLCh *)((long)&normalizedURI + 2),local_40);
  bbSys.fMgr = (XMLBufferMgr *)XMLBuffer::getRawBuffer(local_40);
  XMLBufBid::XMLBufBid((XMLBufBid *)&expSysId,&(this->super_XMLScanner).fBufMgr);
  this_00 = XMLBufBid::getBuffer((XMLBufBid *)&expSysId);
  lastInfo.colNumber = 0;
  if ((this->super_XMLScanner).fEntityHandler == (XMLEntityHandler *)0x0) {
    XMLBuffer::set(this_00,(XMLCh *)bbSys.fMgr);
  }
  else {
    pXVar1 = (this->super_XMLScanner).fEntityHandler;
    uVar3 = (*pXVar1->_vptr_XMLEntityHandler[3])(pXVar1,bbSys.fMgr,this_00);
    if ((uVar3 & 1) == 0) {
      XMLBuffer::set(this_00,(XMLCh *)bbSys.fMgr);
    }
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo
              ((LastExtEntityInfo *)&resourceIdentifier.fLocator);
    ReaderMgr::getLastExtEntityInfo
              (&(this->super_XMLScanner).fReaderMgr,
               (LastExtEntityInfo *)&resourceIdentifier.fLocator);
    pXVar5 = XMLBuffer::getRawBuffer(this_00);
    XMLResourceIdentifier::XMLResourceIdentifier
              ((XMLResourceIdentifier *)local_c8,ExternalEntity,pXVar5,(XMLCh *)0x0,
               (XMLCh *)nnSys.fMgr,(XMLCh *)resourceIdentifier.fLocator,
               &(this->super_XMLScanner).fReaderMgr.super_Locator);
    pXVar1 = (this->super_XMLScanner).fEntityHandler;
    iVar4 = (*pXVar1->_vptr_XMLEntityHandler[5])(pXVar1,local_c8);
    lastInfo.colNumber = CONCAT44(extraout_var,iVar4);
    XMLResourceIdentifier::~XMLResourceIdentifier((XMLResourceIdentifier *)local_c8);
  }
  if ((lastInfo.colNumber == 0) &&
     (((this->super_XMLScanner).fDisableDefaultEntityResolution & 1U) == 0)) {
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)&urlTmp.fHasInvalidChar);
    ReaderMgr::getLastExtEntityInfo
              (&(this->super_XMLScanner).fReaderMgr,(LastExtEntityInfo *)&urlTmp.fHasInvalidChar);
    XMLURL::XMLURL((XMLURL *)&ddSys.fMgr,(this->super_XMLScanner).fMemoryManager);
    baseURL = urlTmp._80_8_;
    pXVar5 = XMLBuffer::getRawBuffer(this_00);
    bVar2 = XMLURL::setURL((XMLURL *)&ddSys.fMgr,(XMLCh *)baseURL,pXVar5,(XMLURL *)&ddSys.fMgr);
    if ((!bVar2) || (bVar2 = XMLURL::isRelative((XMLURL *)&ddSys.fMgr), bVar2)) {
      if (((this->super_XMLScanner).fStandardUriConformant & 1U) != 0) {
        pMVar6 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xabc,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(pMVar6,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      XMLBufBid::XMLBufBid((XMLBufBid *)&resolvedSysId,&(this->super_XMLScanner).fBufMgr);
      normalizedURI_00 = XMLBufBid::getBuffer((XMLBufBid *)&resolvedSysId);
      pXVar5 = XMLBuffer::getRawBuffer(this_00);
      XMLUri::normalizeURI(pXVar5,normalizedURI_00);
      lastInfo.colNumber =
           (XMLFileLoc)XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
      pXVar5 = XMLBuffer::getRawBuffer(normalizedURI_00);
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)lastInfo.colNumber,(XMLCh *)urlTmp._80_8_,pXVar5,
                 (this->super_XMLScanner).fMemoryManager);
      XMLBufBid::~XMLBufBid((XMLBufBid *)&resolvedSysId);
    }
    else {
      if ((((this->super_XMLScanner).fStandardUriConformant & 1U) != 0) &&
         (bVar2 = XMLURL::hasInvalidChar((XMLURL *)&ddSys.fMgr), bVar2)) {
        pMVar6 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xac1,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(pMVar6,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      lastInfo.colNumber =
           (XMLFileLoc)XMemory::operator_new(0x88,(this->super_XMLScanner).fMemoryManager);
      URLInputSource::URLInputSource
                ((URLInputSource *)lastInfo.colNumber,(XMLURL *)&ddSys.fMgr,
                 (this->super_XMLScanner).fMemoryManager);
    }
    XMLURL::~XMLURL((XMLURL *)&ddSys.fMgr);
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)&expSysId);
  XMLBufBid::~XMLBufBid((XMLBufBid *)&normalizedSysId);
  return (InputSource *)lastInfo.colNumber;
}

Assistant:

InputSource* DGXMLScanner::resolveSystemId(const XMLCh* const sysId
                                          ,const XMLCh* const pubId)
{
    //Normalize sysId
    XMLBufBid nnSys(&fBufMgr);
    XMLBuffer& normalizedSysId = nnSys.getBuffer();
    XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the normalized system id
    XMLBufBid bbSys(&fBufMgr);
    XMLBuffer& expSysId = bbSys.getBuffer();

    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    InputSource* srcToFill = 0;
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);

        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), 0, pubId, lastInfo.systemId,
                            &fReaderMgr);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }
    else
    {
        expSysId.set(normalizedURI);
    }

    //  If they didn't create a source via the entity handler, then we
    //  have to create one on our own.
    if (!srcToFill)
    {
        if (fDisableDefaultEntityResolution)
            return srcToFill;

        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);

        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBufBid  ddSys(&fBufMgr);
                XMLBuffer& resolvedSysId = ddSys.getBuffer();
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
    }

    return srcToFill;
}